

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

SurfaceParameterizationQuantity * __thiscall
polyscope::SurfaceMesh::getParameterization(SurfaceMesh *this,string *name)

{
  pointer pcVar1;
  QuantityType *pQVar2;
  SurfaceParameterizationQuantity *pSVar3;
  string local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  pQVar2 = QuantityStructure<polyscope::SurfaceMesh>::getQuantity
                     (&this->super_QuantityStructure<polyscope::SurfaceMesh>,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (pQVar2 == (QuantityType *)0x0) {
    pSVar3 = (SurfaceParameterizationQuantity *)0x0;
  }
  else {
    pSVar3 = (SurfaceParameterizationQuantity *)
             __dynamic_cast(pQVar2,&SurfaceMeshQuantity::typeinfo,
                            &SurfaceParameterizationQuantity::typeinfo,0);
  }
  return pSVar3;
}

Assistant:

SurfaceParameterizationQuantity* SurfaceMesh::getParameterization(std::string name) {
  SurfaceMeshQuantity* newQ = this->getQuantity(name);
  SurfaceParameterizationQuantity* param = dynamic_cast<SurfaceParameterizationQuantity*>(newQ);
  return param;
}